

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoCube>::Write
          (TPZGeoElRefLess<pzgeom::TPZGeoCube> *this,TPZStream *buf,int withclassid)

{
  long lVar1;
  
  TPZGeoEl::Write(&this->super_TPZGeoEl,buf,withclassid);
  pztopology::TPZCube::Write((TPZCube *)&this->fGeo,buf,withclassid);
  (*buf->_vptr_TPZStream[5])
            (buf,(this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes,8);
  lVar1 = 0x88;
  do {
    (**(code **)(*(long *)((long)(this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes
                          + lVar1 + -0x48) + 0x28))
              ((long)(this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes +
               lVar1 + -0x48,buf,withclassid);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x310);
  return;
}

Assistant:

void TPZGeoElRefLess<TGeo>::Write(TPZStream &buf, int withclassid) const {
    TPZGeoEl::Write(buf, withclassid);
    fGeo.Write(buf, withclassid);
    for (unsigned int i = 0; i < TGeo::NSides; ++i) {
        this->fNeighbours[i].Write(buf, withclassid);
    }
}